

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.c
# Opt level: O0

void do_func(int *ip)

{
  int *ip_local;
  
  if (pass == 1) {
    println();
  }
  else if (lablptr == (t_symbol *)0x0) {
    error("No name for this function!");
  }
  else if (lablptr->refcnt == 0) {
    func_install(*ip);
  }
  else {
    if (lablptr->type == 5) {
      fatal_error("Symbol already used by a macro!");
    }
    else if (lablptr->type != 6) {
      fatal_error("Symbol already used by a label!");
      return;
    }
    fatal_error("Function already defined!");
  }
  return;
}

Assistant:

void
do_func(int *ip)
{
	if (pass == LAST_PASS)
		println();
	else {
		/* error checking */
		if (lablptr == NULL) {
			error("No name for this function!");
			return;
		}
		if (lablptr->refcnt) {
			switch (lablptr->type) {
			case MACRO:
				fatal_error("Symbol already used by a macro!");

			case FUNC:
				fatal_error("Function already defined!");
				return;

			default:
				fatal_error("Symbol already used by a label!");
				return;
			}
		}

		/* install this new function in the hash table */
		if (!func_install(*ip))
			return;
	} 
}